

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O2

int mbedtls_mpi_mul_int(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi_uint b)

{
  ulong uVar1;
  int iVar2;
  size_t s_len;
  
  uVar1 = (ulong)A->n;
  do {
    s_len = uVar1;
    if (s_len == 0) goto LAB_00f05dc1;
    uVar1 = s_len - 1;
  } while (A->p[s_len - 1] == 0);
  if (b != 0) {
    iVar2 = mbedtls_mpi_grow(X,s_len + 1);
    if (iVar2 == 0) {
      iVar2 = mbedtls_mpi_copy(X,A);
      if (iVar2 == 0) {
        mbedtls_mpi_core_mla(X->p,(ulong)X->n,A->p,s_len,b - 1);
        iVar2 = 0;
      }
    }
    return iVar2;
  }
LAB_00f05dc1:
  iVar2 = mbedtls_mpi_lset(X,0);
  return iVar2;
}

Assistant:

int mbedtls_mpi_mul_int(mbedtls_mpi *X, const mbedtls_mpi *A, mbedtls_mpi_uint b)
{
    size_t n = A->n;
    while (n > 0 && A->p[n - 1] == 0) {
        --n;
    }

    /* The general method below doesn't work if b==0. */
    if (b == 0 || n == 0) {
        return mbedtls_mpi_lset(X, 0);
    }

    /* Calculate A*b as A + A*(b-1) to take advantage of mbedtls_mpi_core_mla */
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    /* In general, A * b requires 1 limb more than b. If
     * A->p[n - 1] * b / b == A->p[n - 1], then A * b fits in the same
     * number of limbs as A and the call to grow() is not required since
     * copy() will take care of the growth if needed. However, experimentally,
     * making the call to grow() unconditional causes slightly fewer
     * calls to calloc() in ECP code, presumably because it reuses the
     * same mpi for a while and this way the mpi is more likely to directly
     * grow to its final size.
     *
     * Note that calculating A*b as 0 + A*b doesn't work as-is because
     * A,X can be the same. */
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, n + 1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, A));
    mbedtls_mpi_core_mla(X->p, X->n, A->p, n, b - 1);

cleanup:
    return ret;
}